

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

parser * parse_cmdline(parser *__return_storage_ptr__,int argc,char **argv)

{
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  undefined1 local_21;
  char **local_20;
  char **argv_local;
  parser *ppStack_10;
  int argc_local;
  parser *argparser;
  
  local_21 = 0;
  local_20 = argv;
  argv_local._4_4_ = argc;
  ppStack_10 = __return_storage_ptr__;
  cmdline::parser::parser(__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"interaction",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"in interaction mode (default)",&local_81);
  cmdline::parser::add(__return_storage_ptr__,&local_48,'i',&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"version",&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"show the info of version",&local_d1);
  cmdline::parser::add(__return_storage_ptr__,&local_a8,'v',&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  cmdline::parser::parse_check(__return_storage_ptr__,argv_local._4_4_,local_20);
  return __return_storage_ptr__;
}

Assistant:

cmdline::parser parse_cmdline(int argc, char **argv) {
    cmdline::parser argparser;

    // argparser: use '-i' or '--interaction' to get into interaction mode
    argparser.add("interaction", 'i', "in interaction mode (default)");
    // argparser: use '-v' or '--version' to show the version info
    argparser.add("version",     'v', "show the info of version");
    // argparser: use '-h' or '--help' to show the version info
    // [...](define by deafault)

    argparser.parse_check(argc, argv);
    return argparser;
}